

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedicated.cpp
# Opt level: O0

void anon_unknown.dwarf_1252b8::Dedicated_setParamf(EffectProps *props,ALenum param,float val)

{
  bool bVar1;
  effect_exception *peVar2;
  uint in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  
  if (in_ESI != 1) {
    peVar2 = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (peVar2,0xa002,"Invalid dedicated float property 0x%04x",(ulong)in_ESI);
    __cxa_throw(peVar2,&effect_exception::typeinfo,effect_exception::~effect_exception);
  }
  if (0.0 <= in_XMM0_Da) {
    bVar1 = std::isfinite(in_XMM0_Da);
    if (bVar1) {
      *in_RDI = in_XMM0_Da;
      return;
    }
  }
  peVar2 = (effect_exception *)__cxa_allocate_exception(0x30);
  effect_exception::effect_exception(peVar2,0xa003,"Dedicated gain out of range");
  __cxa_throw(peVar2,&effect_exception::typeinfo,effect_exception::~effect_exception);
}

Assistant:

void Dedicated_setParamf(EffectProps *props, ALenum param, float val)
{
    switch(param)
    {
    case AL_DEDICATED_GAIN:
        if(!(val >= 0.0f && std::isfinite(val)))
            throw effect_exception{AL_INVALID_VALUE, "Dedicated gain out of range"};
        props->Dedicated.Gain = val;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid dedicated float property 0x%04x", param};
    }
}